

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environments.cpp
# Opt level: O1

bool fill_environment(shared_ptr<SchemeEnvironment> *env,shared_ptr<SchemePair> *np,
                     shared_ptr<SchemePair> *vp)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  SchemePair *__tmp;
  long lVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  while( true ) {
    peVar1 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return true;
    }
    if (peVar1 == (element_type *)
                  scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      return true;
    }
    peVar5 = (vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      return true;
    }
    if (peVar5 == (element_type *)
                  scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    break;
    peVar2 = (peVar1->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemeSymbol::typeinfo);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this = (peVar1->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
    }
    if (lVar4 != 0) {
      Context::set(&((env->super___shared_ptr<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->context,(string *)(lVar4 + 8),
                   &((vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->car);
      peVar1 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2 = (peVar1->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        peVar5 = (element_type *)0x0;
      }
      else {
        peVar5 = (element_type *)
                 __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemePair::typeinfo);
      }
      if (peVar5 == (element_type *)0x0) {
        peVar5 = (element_type *)0x0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var6 = (peVar1->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
      }
      (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
      p_Var3 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var6;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      peVar1 = (vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2 = (peVar1->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        peVar5 = (element_type *)0x0;
      }
      else {
        peVar5 = (element_type *)
                 __dynamic_cast(peVar2,&SchemeObject::typeinfo,&SchemePair::typeinfo);
      }
      if (peVar5 == (element_type *)0x0) {
        peVar5 = (element_type *)0x0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var6 = (peVar1->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
      }
      (vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
      p_Var3 = (vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var6;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (lVar4 == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool fill_environment(const std::shared_ptr<SchemeEnvironment> &env, std::shared_ptr<SchemePair> np,
                             std::shared_ptr<SchemePair> vp)
{
    while(np && np != scheme_nil && vp && vp != scheme_nil)
    {
        auto s = std::dynamic_pointer_cast<SchemeSymbol>(np->car);
        if(!s)
            return false;
        env->context.set(s->value, vp->car);
        np = std::dynamic_pointer_cast<SchemePair>(np->cdr);
        vp = std::dynamic_pointer_cast<SchemePair>(vp->cdr);
    }
    return true;
}